

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute __thiscall pugi::xml_node::attribute(xml_node *this,char_t *name_)

{
  bool bVar1;
  long *in_RDI;
  char_t *iname;
  xml_attribute_struct *i;
  char_t *in_stack_ffffffffffffffc8;
  xml_attribute_struct *local_20;
  xml_attribute local_8;
  
  if (*in_RDI == 0) {
    xml_attribute::xml_attribute(&local_8);
  }
  else {
    for (local_20 = *(xml_attribute_struct **)(*in_RDI + 0x38);
        local_20 != (xml_attribute_struct *)0x0; local_20 = local_20->next_attribute) {
      if ((local_20->name != (char_t *)0x0) &&
         (bVar1 = impl::anon_unknown_0::strequal((char_t *)in_RDI,in_stack_ffffffffffffffc8), bVar1)
         ) {
        xml_attribute::xml_attribute(&local_8,local_20);
        return (xml_attribute)local_8._attr;
      }
    }
    xml_attribute::xml_attribute(&local_8);
  }
  return (xml_attribute)local_8._attr;
}

Assistant:

PUGI_IMPL_FN xml_attribute xml_node::attribute(const char_t* name_) const
	{
		if (!_root) return xml_attribute();

		for (xml_attribute_struct* i = _root->first_attribute; i; i = i->next_attribute)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
				return xml_attribute(i);
		}

		return xml_attribute();
	}